

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CThumbInstruction.cpp
# Opt level: O3

void __thiscall
CThumbInstruction::CThumbInstruction
          (CThumbInstruction *this,tThumbOpcode *sourceOpcode,ThumbOpcodeVariables *vars)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined2 uVar4;
  int iVar5;
  uint uVar6;
  bool bVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  
  CAssemblerCommand::CAssemblerCommand((CAssemblerCommand *)this);
  (this->super_ArmOpcodeCommand).super_CAssemblerCommand._vptr_CAssemblerCommand =
       (_func_int **)&PTR__CThumbInstruction_001bd538;
  (this->Vars).rd.name._name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this->Vars).rd.name._name.field_2 + 8) = 0;
  (this->Vars).rd.name._name._M_dataplus._M_p = (pointer)&(this->Vars).rd.name._name.field_2;
  (this->Vars).rd.name._name._M_string_length = 0;
  (this->Vars).rs.name._name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this->Vars).rs.name._name.field_2 + 8) = 0;
  (this->Vars).rs.name._name._M_dataplus._M_p = (pointer)&(this->Vars).rs.name._name.field_2;
  (this->Vars).rs.name._name._M_string_length = 0;
  (this->Vars).rn.name._name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this->Vars).rn.name._name.field_2 + 8) = 0;
  (this->Vars).rn.name._name._M_dataplus._M_p = (pointer)&(this->Vars).rn.name._name.field_2;
  (this->Vars).rn.name._name._M_string_length = 0;
  (this->Vars).ro.name._name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this->Vars).ro.name._name.field_2 + 8) = 0;
  (this->Vars).ro.name._name._M_dataplus._M_p = (pointer)&(this->Vars).ro.name._name.field_2;
  (this->Vars).ro.name._name._M_string_length = 0;
  (this->Vars).ImmediateExpression.expression.
  super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->Vars).ImmediateExpression.expression.
  super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->Vars).ImmediateExpression.constExpression = true;
  pcVar1 = sourceOpcode->mask;
  (this->Opcode).name = sourceOpcode->name;
  (this->Opcode).mask = pcVar1;
  uVar4 = *(undefined2 *)&sourceOpcode->field_0x12;
  iVar5 = sourceOpcode->flags;
  (this->Opcode).encoding = sourceOpcode->encoding;
  *(undefined2 *)&(this->Opcode).field_0x12 = uVar4;
  (this->Opcode).flags = iVar5;
  std::__cxx11::string::_M_assign((string *)&this->Vars);
  (this->Vars).rd.num = (vars->rd).num;
  std::__cxx11::string::_M_assign((string *)&(this->Vars).rs);
  (this->Vars).rs.num = (vars->rs).num;
  std::__cxx11::string::_M_assign((string *)&(this->Vars).rn);
  (this->Vars).rn.num = (vars->rn).num;
  std::__cxx11::string::_M_assign((string *)&(this->Vars).ro);
  (this->Vars).ro.num = (vars->ro).num;
  (this->Vars).ImmediateExpression.expression.
  super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (vars->ImmediateExpression).expression.
       super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->Vars).ImmediateExpression.expression.
              super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(vars->ImmediateExpression).expression.
              super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (this->Vars).ImmediateExpression.constExpression = (vars->ImmediateExpression).constExpression;
  *(undefined8 *)((this->Vars).RlistStr + 0x18) = *(undefined8 *)(vars->RlistStr + 0x18);
  iVar5 = vars->Immediate;
  iVar11 = vars->ImmediateBitLen;
  iVar12 = vars->OriginalImmediate;
  iVar13 = vars->rlist;
  uVar6 = vars->NewEncoding;
  bVar7 = vars->UseNewEncoding;
  cVar8 = vars->RlistStr[0];
  cVar9 = vars->RlistStr[1];
  cVar10 = vars->RlistStr[2];
  uVar2 = *(undefined8 *)(vars->RlistStr + 3);
  uVar3 = *(undefined8 *)(vars->RlistStr + 0x13);
  *(undefined8 *)((this->Vars).RlistStr + 0xb) = *(undefined8 *)(vars->RlistStr + 0xb);
  *(undefined8 *)((this->Vars).RlistStr + 0x13) = uVar3;
  (this->Vars).NewEncoding = uVar6;
  (this->Vars).UseNewEncoding = bVar7;
  (this->Vars).RlistStr[0] = cVar8;
  (this->Vars).RlistStr[1] = cVar9;
  (this->Vars).RlistStr[2] = cVar10;
  *(undefined8 *)((this->Vars).RlistStr + 3) = uVar2;
  (this->Vars).Immediate = iVar5;
  (this->Vars).ImmediateBitLen = iVar11;
  (this->Vars).OriginalImmediate = iVar12;
  (this->Vars).rlist = iVar13;
  this->OpcodeSize = (ulong)((uint)(this->Opcode).flags >> 0xb & 2) + 2;
  return;
}

Assistant:

CThumbInstruction::CThumbInstruction(const tThumbOpcode& sourceOpcode, ThumbOpcodeVariables& vars)
{
	this->Opcode = sourceOpcode;
	this->Vars = vars;
	
	OpcodeSize = Opcode.flags & THUMB_LONG ? 4 : 2;
}